

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall FIX::Parser::readFixMessage(Parser *this,string *str)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  MessageParseError *e;
  int local_2c;
  size_type sStack_28;
  int length;
  size_type pos;
  string *str_local;
  Parser *this_local;
  
  sStack_28 = 0;
  pos = (size_type)str;
  str_local = &this->m_buffer;
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 2) {
    this_local._7_1_ = false;
  }
  else {
    sStack_28 = std::__cxx11::string::find((char *)this,0x2dd03f);
    if (sStack_28 == 0xffffffffffffffff) {
      this_local._7_1_ = false;
    }
    else {
      std::__cxx11::string::erase((ulong)this,0);
      local_2c = 0;
      bVar1 = extractLength(this,&local_2c,&stack0xffffffffffffffd8,&this->m_buffer);
      if (bVar1) {
        sStack_28 = (long)local_2c + sStack_28;
        uVar2 = std::__cxx11::string::size();
        if (uVar2 < sStack_28) {
          this_local._7_1_ = false;
        }
        else {
          lVar3 = std::__cxx11::string::find((char *)this,0x2dd042);
          if (lVar3 == -1) {
            this_local._7_1_ = false;
          }
          else {
            sStack_28 = lVar3 + 4;
            lVar3 = std::__cxx11::string::find((char *)this,0x2dd03d);
            if (lVar3 == -1) {
              this_local._7_1_ = false;
            }
            else {
              sStack_28 = lVar3 + 1;
              std::__cxx11::string::assign((string *)pos,(ulong)this,0);
              std::__cxx11::string::erase((ulong)this,0);
              this_local._7_1_ = true;
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

EXCEPT(MessageParseError) {
  std::string::size_type pos = 0;

  if (m_buffer.length() < 2) {
    return false;
  }
  pos = m_buffer.find("8=");
  if (pos == std::string::npos) {
    return false;
  }
  m_buffer.erase(0, pos);

  int length = 0;

  try {
    if (extractLength(length, pos, m_buffer)) {
      pos += length;
      if (m_buffer.size() < pos) {
        return false;
      }

      pos = m_buffer.find("\00110=", pos - 1);
      if (pos == std::string::npos) {
        return false;
      }
      pos += 4;
      pos = m_buffer.find("\001", pos);
      if (pos == std::string::npos) {
        return false;
      }
      pos += 1;

      str.assign(m_buffer, 0, pos);
      m_buffer.erase(0, pos);
      return true;
    }
  } catch (MessageParseError &e) {
    if (length > 0) {
      m_buffer.erase(0, pos + length);
    } else {
      m_buffer.erase();
    }

    throw e;
  }

  return false;
}